

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O3

void ffesum(unsigned_long sum,int complm,char *ascii)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  uint *puVar8;
  bool bVar9;
  long lVar10;
  bool bVar11;
  uint local_68 [4];
  char local_58 [32];
  int ch [4];
  char asc [32];
  
  uVar2 = 0xffffffff - sum;
  if (complm == 0) {
    uVar2 = sum;
  }
  pcVar6 = local_58;
  lVar7 = 0;
  do {
    uVar1 = (uint)(((&DAT_001cc870)[lVar7] & uVar2) >> ((char)lVar7 * -8 + 0x18U & 0x3f));
    uVar3 = uVar1 + 3;
    if (-1 < (int)uVar1) {
      uVar3 = uVar1;
    }
    local_68[1] = ((int)uVar3 >> 2) + 0x30;
    local_68[2] = local_68[1];
    local_68[3] = local_68[1];
    local_68[0] = local_68[1] + (uVar1 - (uVar3 & 0xfffffffc));
    lVar4 = 0;
    iVar5 = 0;
    do {
      do {
        uVar1 = (&DAT_001cc830)[lVar4];
        lVar10 = 1;
        puVar8 = local_68;
        bVar11 = true;
        do {
          bVar9 = bVar11;
          if (((*puVar8 & 0xff) == uVar1) || ((byte)local_68[lVar10] == uVar1)) {
            *puVar8 = *puVar8 + 1;
            local_68[lVar10] = local_68[lVar10] - 1;
            iVar5 = iVar5 + 1;
          }
          lVar10 = 3;
          puVar8 = local_68 + 2;
          bVar11 = false;
        } while (bVar9);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xd);
      lVar4 = 0;
      bVar11 = iVar5 != 0;
      iVar5 = 0;
    } while (bVar11);
    lVar4 = 0;
    do {
      pcVar6[lVar4 * 4] = (char)local_68[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar7 = lVar7 + 1;
    pcVar6 = pcVar6 + 1;
  } while (lVar7 != 4);
  lVar7 = 0xf;
  do {
    ascii[lVar7 + -0xf] = local_58[(uint)lVar7 & 0xf];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1f);
  ascii[0x10] = '\0';
  return;
}

Assistant:

void ffesum(unsigned long sum,  /* I - accumulated checksum                */
           int complm,          /* I - = 1 to encode complement of the sum */
           char *ascii)         /* O - 16-char ASCII encoded checksum      */
/*
    encode the 32 bit checksum by converting every 
    2 bits of each byte into an ASCII character (32 bit word encoded 
    as 16 character string).   Only ASCII letters and digits are used
    to encode the values (no ASCII punctuation characters).

    If complm=TRUE, then the complement of the sum will be encoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    unsigned int exclude[13] = { 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f, 0x40,
                                       0x5b, 0x5c, 0x5d, 0x5e, 0x5f, 0x60 };
    unsigned long mask[4] = { 0xff000000, 0xff0000, 0xff00, 0xff  };

    int offset = 0x30;     /* ASCII 0 (zero) */

    unsigned long value;
    int byte, quotient, remainder, ch[4], check, ii, jj, kk;
    char asc[32];

    if (complm)
        value = 0xFFFFFFFF - sum;   /* complement each bit of the value */
    else
        value = sum;

    for (ii = 0; ii < 4; ii++)
    {
        byte = (value & mask[ii]) >> (24 - (8 * ii));
        quotient = byte / 4 + offset;
        remainder = byte % 4;
        for (jj = 0; jj < 4; jj++)
            ch[jj] = quotient;

        ch[0] += remainder;

        for (check = 1; check;)   /* avoid ASCII  punctuation */
            for (check = 0, kk = 0; kk < 13; kk++)
                for (jj = 0; jj < 4; jj += 2)
                    if ((unsigned char) ch[jj] == exclude[kk] ||
                        (unsigned char) ch[jj+1] == exclude[kk])
                    {
                        ch[jj]++;
                        ch[jj+1]--;
                        check++;
                    }

        for (jj = 0; jj < 4; jj++)        /* assign the bytes */
            asc[4*jj+ii] = ch[jj];
    }

    for (ii = 0; ii < 16; ii++)       /* shift the bytes 1 to the right */
        ascii[ii] = asc[(ii+15)%16];

    ascii[16] = '\0';
}